

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::logger<std::shared_ptr<spdlog::sinks::sink>const*>
          (logger *this,string *name,shared_ptr<spdlog::sinks::sink> *begin,
          shared_ptr<spdlog::sinks::sink> *end)

{
  shared_ptr<spdlog::sinks::sink> *__last;
  shared_ptr<spdlog::sinks::sink> *__first;
  allocator<std::shared_ptr<spdlog::sinks::sink>_> local_29;
  shared_ptr<spdlog::sinks::sink> *local_28;
  shared_ptr<spdlog::sinks::sink> *end_local;
  shared_ptr<spdlog::sinks::sink> *begin_local;
  string *name_local;
  logger *this_local;
  
  this->_vptr_logger = (_func_int **)&PTR__logger_00578b50;
  local_28 = end;
  end_local = begin;
  begin_local = (shared_ptr<spdlog::sinks::sink> *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  __first = end_local;
  __last = local_28;
  std::allocator<std::shared_ptr<spdlog::sinks::sink>_>::allocator(&local_29);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
  ::vector<std::shared_ptr<spdlog::sinks::sink>const*,void>
            ((vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
              *)&this->sinks_,__first,__last,&local_29);
  std::allocator<std::shared_ptr<spdlog::sinks::sink>_>::~allocator(&local_29);
  std::atomic<int>::atomic(&this->level_,2);
  std::atomic<int>::atomic(&this->flush_level_,6);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->custom_err_handler_,(nullptr_t)0x0);
  details::backtracer::backtracer(&this->tracer_);
  return;
}

Assistant:

logger(std::string name, It begin, It end)
        : name_(std::move(name)),
          sinks_(begin, end) {}